

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

absolute_lookup * __thiscall
absl::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          TransitionType *tt)

{
  ulong uVar1;
  fields fVar2;
  
  fVar2 = detail::step(0x7b2,0x101);
  fVar2 = detail::step(fVar2.y,fVar2._8_8_ & 0xffffffffff,(long)tt->utc_offset);
  uVar1 = fVar2._8_8_ & 0xffffffffff;
  (__return_storage_ptr__->cs).f_.y = fVar2.y;
  (__return_storage_ptr__->cs).f_.m = (char)uVar1;
  (__return_storage_ptr__->cs).f_.d = (char)(uVar1 >> 8);
  (__return_storage_ptr__->cs).f_.hh = (char)(uVar1 >> 0x10);
  (__return_storage_ptr__->cs).f_.mm = (char)(uVar1 >> 0x18);
  (__return_storage_ptr__->cs).f_.ss = (char)(uVar1 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->cs).f_.field_0xd = (int3)(uVar1 >> 0x28);
  __return_storage_ptr__->offset = tt->utc_offset;
  __return_storage_ptr__->is_dst = tt->is_dst;
  __return_storage_ptr__->abbr = (this->abbreviations_)._M_dataplus._M_p + tt->abbr_index;
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(
    std::int_fast64_t unix_time, const TransitionType& tt) const {
  // A civil time in "+offset" looks like (time+offset) in UTC.
  // Note: We perform two additions in the civil_second domain to
  // sidestep the chance of overflow in (unix_time + tt.utc_offset).
  return {(civil_second() + unix_time) + tt.utc_offset, tt.utc_offset,
          tt.is_dst, &abbreviations_[tt.abbr_index]};
}